

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_console.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long in_RSI;
  int in_EDI;
  ComplexBot complexBot;
  Runner runner;
  int playersNum;
  char *gameName;
  int port;
  char *host;
  char *login;
  int in_stack_fffffffffffffaec;
  IBot in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffafc;
  ComplexBot *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  Runner *in_stack_fffffffffffffb10;
  Runner *in_stack_fffffffffffffd80;
  
  if (1 < in_EDI) {
    if (in_EDI != 6) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Wrong number of arguments.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Usage:  console (login) (host) (port) (game) (playersNum)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return -1;
    }
    iVar1 = atoi(*(char **)(in_RSI + 0x18));
    iVar2 = atoi(*(char **)(in_RSI + 0x28));
    if (iVar1 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid port.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return -1;
    }
    if (iVar2 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid players num.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return -1;
    }
  }
  tiger::trains::Runner::Runner
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00,
             in_stack_fffffffffffffafc,(char *)in_stack_fffffffffffffaf0._vptr_IBot,
             in_stack_fffffffffffffaec);
  tiger::trains::ai::ComplexBot::ComplexBot((ComplexBot *)in_stack_fffffffffffffaf0._vptr_IBot);
  tiger::trains::Runner::setBot((Runner *)&stack0xfffffffffffffc38,(IBot *)&stack0xfffffffffffffaf0)
  ;
  tiger::trains::Runner::run(in_stack_fffffffffffffd80);
  tiger::trains::ai::ComplexBot::~ComplexBot(in_stack_fffffffffffffb00);
  tiger::trains::Runner::~Runner((Runner *)0x2011ab);
  return 0;
}

Assistant:

INITIALIZE_EASYLOGGINGPP


int main(int argc, char *argv[]){

    const char * login = "Tiger";
    const char * host = "wgforge-srv.wargaming.net";
    int port = 443;
    const char *gameName = "wg-forge3";
    int playersNum = 4;

    if (argc > 1){
        if (argc != 6){
            std::cerr << "Wrong number of arguments." << std::endl;
            std::cerr << "Usage:  console (login) (host) (port) (game) (playersNum)" << std::endl;
            return -1;
        }

        login = argv[1];
        host = argv[2];
        port = atoi(argv[3]);
        gameName = argv[4];
        playersNum = atoi(argv[5]);

        if (!port){
            std::cerr << "Invalid port." << std::endl;
            return -1;
        }

        if (!playersNum)
        {
            std::cerr << "Invalid players num." << std::endl;
            return -1;
        }
    }

    Runner runner(login, host, port, gameName, playersNum);
    ai::ComplexBot complexBot;
    runner.setBot(&complexBot);

    runner.run();

    return 0;
}